

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureFilterMinmaxUtils::Texture3D::generate
          (Texture3D *this,RenderContext *context,IVec3 *size,GLenum format,GLenum type,
          bool generateMipmaps)

{
  MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  Texture3D *this_01;
  undefined1 local_50 [16];
  Vec4 local_40;
  long lVar3;
  
  iVar1 = (*context->_vptr_RenderContext[3])(context);
  lVar3 = CONCAT44(extraout_var,iVar1);
  this_01 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (this_01,context,format,type,size->m_data[0],size->m_data[1],size->m_data[2]);
  local_50._0_8_ = (Texture3D *)0x0;
  this_00 = &this->m_texture;
  if ((this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.m_data
      .ptr != this_01) {
    de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
              (&this_00->super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
    (this_00->super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data.ptr =
         this_01;
  }
  de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
            ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)local_50);
  tcu::Texture3D::allocLevel
            (&((this_00->super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).
               m_data.ptr)->m_refTexture,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glu::Texture3D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x19a);
  local_50._0_8_ = &DAT_3f8000003f800000;
  local_50._8_8_ = &DAT_3f8000003f800000;
  local_40.m_data[0] = 0.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  local_40.m_data[3] = 1.0;
  tcu::fillWithGrid((((this_00->
                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data.
                     ptr)->m_refTexture).super_TextureLevelPyramid.m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,4,(Vec4 *)local_50,&local_40);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glu::Texture3D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x19e);
  glu::Texture3D::upload
            ((this_00->super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data
             .ptr);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glu::Texture3D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x1a1);
  (**(code **)(lVar3 + 8))(0x84c0);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::Texture3D::generate(const glu::RenderContext& context, tcu::IVec3 size,
												   glw::GLenum format, glw::GLenum type, bool generateMipmaps)
{
	DE_UNREF(generateMipmaps);

	const glw::Functions& gl = context.getFunctions();

	m_texture = de::MovePtr<glu::Texture3D>(new glu::Texture3D(context, format, type, size.x(), size.y(), size.z()));

	m_texture->getRefTexture().allocLevel(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture3D error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 4, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture3D error occurred");

	m_texture->upload();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture3D error occurred");

	gl.activeTexture(GL_TEXTURE0);
}